

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O0

void * __thiscall
BitSetImplement<std::bitset<128UL>,_KDefectiveBase>::neighborSetOf
          (BitSetImplement<std::bitset<128UL>,_KDefectiveBase> *this,int idx)

{
  bitset<128UL> *this_00;
  size_type sVar1;
  reference pvVar2;
  int local_24;
  int to;
  int i;
  bitset<128UL> *__Nei__;
  int idx_local;
  BitSetImplement<std::bitset<128UL>,_KDefectiveBase> *this_local;
  
  this_00 = (bitset<128UL> *)operator_new(0x10);
  std::bitset<128UL>::bitset(this_00);
  local_24 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size((this->super_KDefectiveBase).from + idx);
    if (sVar1 <= (ulong)(long)local_24) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((this->super_KDefectiveBase).from + idx,(long)local_24);
    std::bitset<128UL>::set(this_00,(long)*pvVar2,true);
    local_24 = local_24 + 1;
  }
  return this_00;
}

Assistant:

void* BitSetImplement<Bitset, Base>::neighborSetOf(int idx) {
	Bitset *__Nei__ = new Bitset();
	for (int i = 0; i < from[idx].size(); i++) {
		int to = from[idx][i];
		__Nei__ -> set(to);
	}
	return __Nei__;
}